

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  int iVar5;
  byte *end_00;
  byte *pbVar6;
  
  if (ptr == end) {
    return -4;
  }
  uVar4 = (long)end - (long)ptr;
  end_00 = (byte *)(ptr + (uVar4 & 0xfffffffffffffffe));
  if ((uVar4 & 0xfffffffffffffffe) == 0) {
    end_00 = (byte *)end;
  }
  if ((uVar4 & 1) == 0) {
    end_00 = (byte *)end;
  }
  if (uVar4 == 1) {
    return -1;
  }
  bVar1 = *ptr;
  if (0xdb < bVar1) {
    if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)ptr[1]))))
    goto switchD_0015b79d_caseD_3;
    goto switchD_0015b79d_caseD_1d;
  }
  if (bVar1 - 0xd8 < 4) {
switchD_0015b79d_caseD_7:
    if ((long)end_00 - (long)ptr < 4) {
      return -2;
    }
    goto switchD_0015b79d_caseD_3;
  }
  if (bVar1 != 0) {
switchD_0015b79d_caseD_1d:
    bVar2 = ptr[1];
    iVar5 = 0x12;
    if (((*(uint *)((long)namingBitmap +
                   (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] * 0x20 + (uint)(bVar2 >> 5) * 4))
          >> (bVar2 & 0x1f) & 1) != 0) ||
       (iVar5 = 0x13,
       (*(uint *)((long)namingBitmap +
                 (ulong)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] * 0x20 + (uint)(bVar2 >> 5) * 4
                        )) & 1 << (bVar2 & 0x1f)) != 0)) goto LAB_0015b810;
    goto switchD_0015b79d_caseD_3;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1])) {
  case 2:
    pbVar6 = (byte *)(ptr + 2);
    if (pbVar6 == end_00) {
      return -1;
    }
    bVar1 = *pbVar6;
    if (3 < bVar1 - 0xdc) {
      if (bVar1 == 0) {
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
        switch(bVar1) {
        case 0xf:
          iVar5 = big2_scanPi(enc,ptr + 4,(char *)end_00,nextTokPtr);
          return iVar5;
        case 0x10:
          iVar5 = big2_scanDecl(enc,ptr + 4,(char *)end_00,nextTokPtr);
          return iVar5;
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x15:
        case 0x17:
          break;
        case 0x16:
        case 0x18:
switchD_0015bcf8_caseD_16:
          *nextTokPtr = ptr;
          return 0x1d;
        default:
          if ((bVar1 - 5 < 3) || (bVar1 == 0x1d)) goto switchD_0015bcf8_caseD_16;
        }
      }
      else if ((bVar1 != 0xff) || ((byte)ptr[3] < 0xfe)) goto switchD_0015bcf8_caseD_16;
    }
    *nextTokPtr = (char *)pbVar6;
    goto LAB_0015b76d;
  default:
    goto switchD_0015b79d_caseD_3;
  case 4:
    pbVar6 = (byte *)(ptr + 2);
    if (pbVar6 == end_00) {
      iVar5 = -0x1a;
    }
    else {
      if ((*pbVar6 == 0) && (ptr[3] == ']')) {
        if ((byte *)(ptr + 4) == end_00) {
          return -1;
        }
        if ((ptr[4] == 0) && (ptr[5] == '>')) {
          *nextTokPtr = ptr + 6;
          return 0x22;
        }
      }
      *nextTokPtr = (char *)pbVar6;
      iVar5 = 0x1a;
    }
    break;
  case 5:
switchD_0015b79d_caseD_5:
    if ((long)end_00 - (long)ptr < 2) {
      return -2;
    }
    goto switchD_0015b79d_caseD_3;
  case 6:
switchD_0015b79d_caseD_6:
    if ((long)end_00 - (long)ptr < 3) {
      return -2;
    }
switchD_0015b79d_caseD_3:
    *nextTokPtr = ptr;
LAB_0015b76d:
    iVar5 = 0;
    break;
  case 7:
    goto switchD_0015b79d_caseD_7;
  case 9:
    if ((byte *)(ptr + 2) == end_00) {
      return -0xf;
    }
  case 10:
  case 0x15:
    do {
      pbVar6 = (byte *)ptr;
      ptr = (char *)(pbVar6 + 2);
      if (((byte *)ptr == end_00) || (*ptr != 0)) break;
      cVar3 = *(char *)((long)enc[1].scanners + (ulong)pbVar6[3]);
    } while (((cVar3 == '\x15') || (cVar3 == '\n')) || ((cVar3 == '\t' && (pbVar6 + 4 != end_00))));
    *nextTokPtr = ptr;
    iVar5 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x11;
    break;
  case 0xc:
    iVar5 = 0xc;
    goto LAB_0015bb93;
  case 0xd:
    iVar5 = 0xd;
LAB_0015bb93:
    iVar5 = big2_scanLit(iVar5,enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar5;
  case 0x13:
    iVar5 = big2_scanPoundName(enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar5;
  case 0x14:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x19;
    break;
  case 0x16:
  case 0x18:
    iVar5 = 0x12;
    goto LAB_0015b810;
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
    iVar5 = 0x13;
LAB_0015b810:
    ptr = ptr + 2;
    if ((byte *)ptr != end_00) {
LAB_0015b832:
      bVar1 = *ptr;
      if (bVar1 < 0xdc) {
        if (bVar1 != 0) {
          if (3 < bVar1 - 0xd8) goto switchD_0015b86d_caseD_1d;
          goto switchD_0015b79d_caseD_7;
        }
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1])) {
        case 5:
          goto switchD_0015b79d_caseD_5;
        case 6:
          goto switchD_0015b79d_caseD_6;
        case 7:
          goto switchD_0015b79d_caseD_7;
        default:
          goto switchD_0015b79d_caseD_3;
        case 9:
        case 10:
        case 0xb:
        case 0x14:
        case 0x15:
        case 0x1e:
        case 0x20:
        case 0x23:
        case 0x24:
          *nextTokPtr = ptr;
          return iVar5;
        case 0xf:
          if (iVar5 != 0x13) {
            *nextTokPtr = (char *)((byte *)ptr + 2);
            return 0x1e;
          }
          goto switchD_0015b79d_caseD_3;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_0015b86d_caseD_16;
        case 0x17:
          goto switchD_0015b86d_caseD_17;
        case 0x1d:
          goto switchD_0015b86d_caseD_1d;
        case 0x21:
          if (iVar5 != 0x13) {
            *nextTokPtr = (char *)((byte *)ptr + 2);
            return 0x1f;
          }
          goto switchD_0015b79d_caseD_3;
        case 0x22:
          if (iVar5 != 0x13) {
            *nextTokPtr = (char *)((byte *)ptr + 2);
            return 0x20;
          }
          goto switchD_0015b79d_caseD_3;
        }
      }
      if (bVar1 == 0xff) {
        if (0xfd < ((byte *)ptr)[1]) goto switchD_0015b79d_caseD_3;
      }
      else if (bVar1 - 0xdc < 4) goto switchD_0015b79d_caseD_3;
switchD_0015b86d_caseD_1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(((byte *)ptr)[1] >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
           (((byte *)ptr)[1] & 0x1f) & 1) == 0) goto switchD_0015b79d_caseD_3;
switchD_0015b86d_caseD_16:
      pbVar6 = (byte *)ptr + 2;
LAB_0015b92b:
      ptr = (char *)pbVar6;
      if (pbVar6 == end_00) goto LAB_0015b9f1;
      goto LAB_0015b832;
    }
LAB_0015b9f1:
    iVar5 = -iVar5;
    break;
  case 0x1d:
    goto switchD_0015b79d_caseD_1d;
  case 0x1e:
    iVar5 = big2_scanPercent(enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar5;
  case 0x1f:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x17;
    break;
  case 0x20:
    pbVar6 = (byte *)(ptr + 2);
    if (pbVar6 == end_00) {
      return -0x18;
    }
    if (*pbVar6 == 0) {
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
      if (bVar1 < 0x20) {
        if (bVar1 - 9 < 3) {
switchD_0015bcb3_caseD_20:
          *nextTokPtr = (char *)pbVar6;
          return 0x18;
        }
        if (bVar1 == 0xf) {
          *nextTokPtr = ptr + 4;
          return 0x23;
        }
        if (bVar1 == 0x15) goto switchD_0015bcb3_caseD_20;
      }
      else {
        switch(bVar1) {
        case 0x20:
        case 0x23:
        case 0x24:
          goto switchD_0015bcb3_caseD_20;
        case 0x21:
          *nextTokPtr = ptr + 4;
          return 0x24;
        case 0x22:
          *nextTokPtr = ptr + 4;
          return 0x25;
        }
      }
    }
    *nextTokPtr = (char *)pbVar6;
    goto LAB_0015b76d;
  case 0x23:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x15;
  }
  return iVar5;
switchD_0015b86d_caseD_17:
  pbVar6 = (byte *)ptr + 2;
  if (iVar5 == 0x29) {
    iVar5 = 0x13;
  }
  else if (iVar5 == 0x12) {
    if (pbVar6 == end_00) {
      return -1;
    }
    bVar1 = *pbVar6;
    iVar5 = 0x13;
    if (bVar1 < 0xdc) {
      if (bVar1 != 0) {
        if (bVar1 - 0xd8 < 4) {
LAB_0015b9d7:
          if ((long)end_00 - (long)pbVar6 < 4) {
            return -2;
          }
          goto LAB_0015b9e9;
        }
        goto LAB_0015b979;
      }
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]);
      if (bVar2 < 0x18) {
        if (0x15 < bVar2) {
          if (bVar2 == 0x16) goto LAB_0015b99d;
          goto LAB_0015b92b;
        }
        if (bVar2 == 5) {
          if ((long)end_00 - (long)pbVar6 < 2) {
            return -2;
          }
        }
        else {
          if (bVar2 != 6) {
            if (bVar2 == 7) goto LAB_0015b9d7;
            goto LAB_0015b92b;
          }
          if ((long)end_00 - (long)pbVar6 < 3) {
            return -2;
          }
        }
        goto LAB_0015b9e9;
      }
      if (3 < bVar2 - 0x18) {
        if (bVar2 == 0x1d) goto LAB_0015b979;
        goto LAB_0015b92b;
      }
    }
    else {
      if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < ((byte *)ptr)[3])))) goto LAB_0015b92b;
LAB_0015b979:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(((byte *)ptr)[3] >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
           (((byte *)ptr)[3] & 0x1f) & 1) == 0) {
LAB_0015b9e9:
        *nextTokPtr = (char *)pbVar6;
        goto LAB_0015b76d;
      }
    }
LAB_0015b99d:
    pbVar6 = (byte *)ptr + 4;
    iVar5 = 0x29;
  }
  goto LAB_0015b92b;
}

Assistant:

static
int PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                      const char **nextTokPtr)
{
  int tok;
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end)
      return -XML_TOK_PROLOG_S;
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (ptr == end)
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      if (ptr + MINBPC(enc) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        if (ptr == end)
          return XML_TOK_PARTIAL;
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}